

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gather.cpp
# Opt level: O3

void duckdb::RowOperations::Gather
               (Vector *rows,SelectionVector *row_sel,Vector *col,SelectionVector *col_sel,
               idx_t count,RowLayout *layout,idx_t col_no,idx_t build_size,data_ptr_t heap_ptr)

{
  undefined8 *puVar1;
  PhysicalType PVar2;
  idx_t iVar3;
  sel_t *psVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  byte bVar8;
  undefined8 uVar9;
  data_ptr_t *ppdVar10;
  data_ptr_t *validitymask_locations;
  const_reference pvVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  _Head_base<0UL,_unsigned_long_*,_false> _Var14;
  InternalException *this;
  long lVar15;
  ulong uVar16;
  data_ptr_t pdVar17;
  SelectionVector *pSVar18;
  ulong uVar19;
  SelectionVector *pSVar20;
  data_ptr_t pdVar21;
  value_type vVar22;
  ulong uVar23;
  buffer_ptr<ValidityBuffer> *pbVar24;
  byte bVar25;
  ulong local_a0;
  SelectionVector *local_98;
  ulong local_90;
  SelectionVector *local_88;
  buffer_ptr<ValidityBuffer> *local_80;
  data_ptr_t local_78;
  value_type local_70;
  NestedValidity local_68;
  buffer_ptr<ValidityBuffer> *local_38;
  
  local_98 = row_sel;
  local_90 = count;
  local_88 = col_sel;
  Vector::SetVectorType(col,FLAT_VECTOR);
  uVar19 = local_90;
  PVar2 = (col->type).physical_type_;
  bVar25 = (byte)col_no;
  if (PVar2 < VARCHAR) {
    switch(PVar2) {
    case BOOL:
    case INT8:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          pdVar17[uVar16] = *(data_t *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00aca8c0:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00aca8c0;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case UINT8:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          pdVar17[uVar16] = *(data_t *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acbac0:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acbac0;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case UINT16:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          *(undefined2 *)(pdVar17 + uVar16 * 2) = *(undefined2 *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acb6c6:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acb6c6;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case INT16:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          *(undefined2 *)(pdVar17 + uVar16 * 2) = *(undefined2 *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acb4c7:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acb4c7;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case UINT32:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          *(undefined4 *)(pdVar17 + uVar16 * 4) = *(undefined4 *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acb2c8:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acb2c8;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case INT32:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          *(undefined4 *)(pdVar17 + uVar16 * 4) = *(undefined4 *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acb0cb:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acb0cb;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case UINT64:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          *(undefined8 *)(pdVar17 + uVar16 * 8) = *(undefined8 *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acbcbd:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acbcbd;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case INT64:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          *(undefined8 *)(pdVar17 + uVar16 * 8) = *(undefined8 *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acb8c3:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acb8c3;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    default:
switchD_00aca45f_caseD_a:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_68.list_validity_location = (data_ptr_t)&local_68.entry_idx;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Unimplemented type for RowOperations::Gather","");
      InternalException::InternalException(this,(string *)&local_68);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          *(undefined4 *)(pdVar17 + uVar16 * 4) = *(undefined4 *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acaac1:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acaac1;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case DOUBLE:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          *(undefined8 *)(pdVar17 + uVar16 * 8) = *(undefined8 *)(lVar5 + vVar22);
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acaece:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                vVar22 = local_70;
                pdVar21 = local_78;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              vVar22 = local_70;
              pdVar21 = local_78;
              goto LAB_00acaece;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case INTERVAL:
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      pdVar21 = rows->data;
      pdVar17 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_90 != 0) {
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar23 = 0;
        pSVar18 = local_88;
        uVar19 = local_90;
        pSVar20 = local_98;
        local_78 = pdVar21;
        local_70 = vVar22;
        do {
          uVar12 = uVar23;
          if (pSVar20->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)pSVar20->sel_vector[uVar23];
          }
          uVar16 = uVar23;
          if (pSVar18->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar18->sel_vector[uVar23];
          }
          lVar5 = *(long *)(pdVar21 + uVar12 * 8);
          puVar1 = (undefined8 *)(lVar5 + vVar22);
          uVar9 = puVar1[1];
          *(undefined8 *)(pdVar17 + uVar16 * 0x10) = *puVar1;
          *(undefined8 *)(pdVar17 + uVar16 * 0x10 + 8) = uVar9;
          if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
            _Var14._M_head_impl =
                 (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (build_size < 0x801) {
LAB_00acacca:
              if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_68,&local_a0);
                ppdVar10 = local_68.struct_validity_locations;
                pdVar21 = local_68.list_validity_location;
                local_68.list_validity_location = (data_ptr_t)0x0;
                local_68.struct_validity_locations = (data_ptr_t *)0x0;
                p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pdVar21;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
                if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.struct_validity_locations !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68.struct_validity_locations);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_80);
                _Var14._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var14._M_head_impl;
                pSVar18 = local_88;
                uVar19 = local_90;
                pSVar20 = local_98;
                pdVar21 = local_78;
                vVar22 = local_70;
              }
            }
            else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              local_a0 = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              pdVar21 = local_78;
              vVar22 = local_70;
              goto LAB_00acacca;
            }
            bVar8 = (byte)uVar16 & 0x3f;
            _Var14._M_head_impl[uVar16 >> 6] =
                 _Var14._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      break;
    case LIST:
    case STRUCT:
    case ARRAY:
      local_a0 = local_90;
      pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar22 = *pvVar11;
      iVar3 = layout->heap_pointer_offset;
      pdVar21 = rows->data;
      uVar23 = -(ulong)(uVar19 >> 0x3d != 0) | uVar19 * 8;
      ppdVar10 = (data_ptr_t *)operator_new__(uVar23);
      validitymask_locations = (data_ptr_t *)operator_new__(uVar23);
      if (uVar19 != 0) {
        psVar4 = local_98->sel_vector;
        uVar23 = 0;
        do {
          uVar12 = uVar23;
          if (psVar4 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar4[uVar23];
          }
          pdVar17 = *(data_ptr_t *)(pdVar21 + uVar12 * 8);
          validitymask_locations[uVar23] = pdVar17;
          if (heap_ptr == (data_ptr_t)0x0) {
            pdVar17 = *(data_ptr_t *)(pdVar17 + vVar22);
          }
          else {
            pdVar17 = heap_ptr + *(long *)(pdVar17 + vVar22) + *(long *)(pdVar17 + iVar3);
          }
          ppdVar10[uVar23] = pdVar17;
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      NestedValidity::NestedValidity(&local_68,validitymask_locations,col_no);
      HeapGather(col,&local_a0,local_88,ppdVar10,&local_68);
      operator_delete__(validitymask_locations);
      operator_delete__(ppdVar10);
    }
  }
  else if (PVar2 == VARCHAR) {
    pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
    vVar22 = *pvVar11;
    local_78 = (data_ptr_t)layout->heap_pointer_offset;
    pbVar24 = (buffer_ptr<ValidityBuffer> *)rows->data;
    pdVar21 = col->data;
    FlatVector::VerifyFlatVector(col);
    if (local_90 != 0) {
      local_70 = col_no >> 3;
      local_38 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar23 = 0;
      pSVar18 = local_88;
      uVar19 = local_90;
      pSVar20 = local_98;
      local_80 = pbVar24;
      do {
        uVar12 = uVar23;
        if (pSVar20->sel_vector != (sel_t *)0x0) {
          uVar12 = (ulong)pSVar20->sel_vector[uVar23];
        }
        uVar16 = uVar23;
        if (pSVar18->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)pSVar18->sel_vector[uVar23];
        }
        lVar5 = *(long *)((long)pbVar24 + uVar12 * 8);
        lVar7 = *(long *)(lVar5 + 8 + vVar22);
        lVar15 = uVar16 * 0x10;
        *(undefined8 *)(pdVar21 + lVar15) = *(undefined8 *)(lVar5 + vVar22);
        *(long *)(pdVar21 + lVar15 + 8) = lVar7;
        if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + local_70)) == 0) {
          _Var14._M_head_impl =
               (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (build_size < 0x801) {
LAB_00acbf06:
            if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar17 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar17;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_38);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              pbVar24 = local_80;
            }
          }
          else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
            (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
            local_a0 = build_size;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar10 = local_68.struct_validity_locations;
            pdVar17 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar17;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
            if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_38);
            _Var14._M_head_impl =
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var14._M_head_impl;
            pSVar18 = local_88;
            uVar19 = local_90;
            pSVar20 = local_98;
            pbVar24 = local_80;
            goto LAB_00acbf06;
          }
          bVar8 = (byte)uVar16 & 0x3f;
          _Var14._M_head_impl[uVar16 >> 6] =
               _Var14._M_head_impl[uVar16 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else if ((heap_ptr != (data_ptr_t)0x0) && (0xc < *(uint *)(lVar5 + vVar22))) {
          *(data_ptr_t *)(pdVar21 + lVar15 + 8) =
               heap_ptr + lVar7 + *(long *)(lVar5 + (long)local_78);
        }
        uVar23 = uVar23 + 1;
      } while (uVar19 != uVar23);
    }
  }
  else if (PVar2 == UINT128) {
    pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
    vVar22 = *pvVar11;
    pdVar21 = rows->data;
    pdVar17 = col->data;
    FlatVector::VerifyFlatVector(col);
    if (local_90 != 0) {
      local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar23 = 0;
      pSVar18 = local_88;
      uVar19 = local_90;
      pSVar20 = local_98;
      local_78 = pdVar21;
      local_70 = vVar22;
      do {
        uVar12 = uVar23;
        if (pSVar20->sel_vector != (sel_t *)0x0) {
          uVar12 = (ulong)pSVar20->sel_vector[uVar23];
        }
        uVar16 = uVar23;
        if (pSVar18->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)pSVar18->sel_vector[uVar23];
        }
        lVar5 = *(long *)(pdVar21 + uVar12 * 8);
        puVar1 = (undefined8 *)(lVar5 + vVar22);
        uVar9 = puVar1[1];
        *(undefined8 *)(pdVar17 + uVar16 * 0x10) = *puVar1;
        *(undefined8 *)(pdVar17 + uVar16 * 0x10 + 8) = uVar9;
        if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
          _Var14._M_head_impl =
               (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (build_size < 0x801) {
LAB_00acc113:
            if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              pdVar21 = local_78;
              vVar22 = local_70;
            }
          }
          else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
            (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
            local_a0 = build_size;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar10 = local_68.struct_validity_locations;
            pdVar21 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar21;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
            if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_80);
            _Var14._M_head_impl =
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var14._M_head_impl;
            pSVar18 = local_88;
            uVar19 = local_90;
            pSVar20 = local_98;
            pdVar21 = local_78;
            vVar22 = local_70;
            goto LAB_00acc113;
          }
          bVar8 = (byte)uVar16 & 0x3f;
          _Var14._M_head_impl[uVar16 >> 6] =
               _Var14._M_head_impl[uVar16 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        uVar23 = uVar23 + 1;
      } while (uVar19 != uVar23);
    }
  }
  else {
    if (PVar2 != INT128) goto switchD_00aca45f_caseD_a;
    pvVar11 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
    vVar22 = *pvVar11;
    pdVar21 = rows->data;
    pdVar17 = col->data;
    FlatVector::VerifyFlatVector(col);
    if (local_90 != 0) {
      local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar23 = 0;
      pSVar18 = local_88;
      uVar19 = local_90;
      pSVar20 = local_98;
      local_78 = pdVar21;
      local_70 = vVar22;
      do {
        uVar12 = uVar23;
        if (pSVar20->sel_vector != (sel_t *)0x0) {
          uVar12 = (ulong)pSVar20->sel_vector[uVar23];
        }
        uVar16 = uVar23;
        if (pSVar18->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)pSVar18->sel_vector[uVar23];
        }
        lVar5 = *(long *)(pdVar21 + uVar12 * 8);
        puVar1 = (undefined8 *)(lVar5 + vVar22);
        uVar9 = puVar1[1];
        *(undefined8 *)(pdVar17 + uVar16 * 0x10) = *puVar1;
        *(undefined8 *)(pdVar17 + uVar16 * 0x10 + 8) = uVar9;
        if ((1 << (bVar25 & 7) & (uint)*(byte *)(lVar5 + (col_no >> 3))) == 0) {
          _Var14._M_head_impl =
               (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (build_size < 0x801) {
LAB_00aca6c0:
            if (_Var14._M_head_impl == (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar10 = local_68.struct_validity_locations;
              pdVar21 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar21;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              _Var14._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var14._M_head_impl;
              pSVar18 = local_88;
              uVar19 = local_90;
              pSVar20 = local_98;
              pdVar21 = local_78;
              vVar22 = local_70;
            }
          }
          else if (_Var14._M_head_impl == (unsigned_long *)0x0) {
            (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
            local_a0 = build_size;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar10 = local_68.struct_validity_locations;
            pdVar21 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var6 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar21;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar10;
            if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_80);
            _Var14._M_head_impl =
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var14._M_head_impl;
            pSVar18 = local_88;
            uVar19 = local_90;
            pSVar20 = local_98;
            pdVar21 = local_78;
            vVar22 = local_70;
            goto LAB_00aca6c0;
          }
          bVar8 = (byte)uVar16 & 0x3f;
          _Var14._M_head_impl[uVar16 >> 6] =
               _Var14._M_head_impl[uVar16 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        uVar23 = uVar23 + 1;
      } while (uVar19 != uVar23);
    }
  }
  return;
}

Assistant:

void RowOperations::Gather(Vector &rows, const SelectionVector &row_sel, Vector &col, const SelectionVector &col_sel,
                           const idx_t count, const RowLayout &layout, const idx_t col_no, const idx_t build_size,
                           data_ptr_t heap_ptr) {
	D_ASSERT(rows.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rows.GetType().id() == LogicalTypeId::POINTER); // "Cannot gather from non-pointer type!"

	col.SetVectorType(VectorType::FLAT_VECTOR);
	switch (col.GetType().InternalType()) {
	case PhysicalType::UINT8:
		TemplatedGatherLoop<uint8_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT16:
		TemplatedGatherLoop<uint16_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT32:
		TemplatedGatherLoop<uint32_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT64:
		TemplatedGatherLoop<uint64_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT128:
		TemplatedGatherLoop<uhugeint_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedGatherLoop<int8_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT16:
		TemplatedGatherLoop<int16_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT32:
		TemplatedGatherLoop<int32_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT64:
		TemplatedGatherLoop<int64_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT128:
		TemplatedGatherLoop<hugeint_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::FLOAT:
		TemplatedGatherLoop<float>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGatherLoop<double>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INTERVAL:
		TemplatedGatherLoop<interval_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::VARCHAR:
		GatherVarchar(rows, row_sel, col, col_sel, count, layout, col_no, build_size, heap_ptr);
		break;
	case PhysicalType::LIST:
	case PhysicalType::STRUCT:
	case PhysicalType::ARRAY:
		GatherNestedVector(rows, row_sel, col, col_sel, count, layout, col_no, heap_ptr);
		break;
	default:
		throw InternalException("Unimplemented type for RowOperations::Gather");
	}
}